

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrtInfo.cpp
# Opt level: O2

void __thiscall pbrt::semantic::PBRTInfo::~PBRTInfo(PBRTInfo *this)

{
  std::
  _Rb_tree<std::shared_ptr<pbrt::Material>,_std::shared_ptr<pbrt::Material>,_std::_Identity<std::shared_ptr<pbrt::Material>_>,_std::less<std::shared_ptr<pbrt::Material>_>,_std::allocator<std::shared_ptr<pbrt::Material>_>_>
  ::~_Rb_tree(&(this->usedMaterials)._M_t);
  std::
  _Rb_tree<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::_Identity<std::shared_ptr<pbrt::Object>_>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::shared_ptr<pbrt::Object>_>_>
  ::~_Rb_tree(&(this->alreadyTraversed)._M_t);
  return;
}

Assistant:

PBRTInfo(Scene::SP scene)
      {
        traverse(scene->world);
        numObjects.print("objects");
        numAreaLights.print("areaLights");
        numShapes.print("shapes");
        numTriangles.print("triangles");
        numQuads.print("quads");
        numDisks.print("disks");
        numSpheres.print("spheres");
        numCurves.print("curves");
        numCurveSegments.print("curve segments");
        numLights.print("lights");
        numPointLights.print("point lights");
        numSpotLights.print("spot lights");
        numDistantLights.print("distant lights");
        numInfiniteLights.print("infinite lights");
        std::cout << "total num materials " << usedMaterials.size() << std::endl;
        std::map<std::string,int> matsUsedByType;
        for (auto mat : usedMaterials)
          if (mat)
            matsUsedByType[mat->toString()]++;
          else
            matsUsedByType["null"]++;
            
        std::cout << "material usage by type:" << std::endl;
        for (auto it : matsUsedByType)
          std::cout << " - " << it.second << "x\t" << it.first << std::endl;
        std::cout << "scene bounds " << scene->getBounds() << std::endl;
      }